

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

void __thiscall powerpc_test_cpu::test_shift(powerpc_test_cpu *this)

{
  gen_xer_values(this,0,0x80000000);
  puts("Testing slw");
  test_instruction_RRRSH(this,"slw",0x7c832830);
  puts("Testing slw.");
  test_instruction_RRRSH(this,"slw.",0x7c832831);
  puts("Testing sraw");
  test_instruction_RRRSH(this,"sraw",0x7c832e30);
  puts("Testing sraw.");
  test_instruction_RRRSH(this,"sraw.",0x7c832e31);
  puts("Testing srawi");
  test_instruction_RRS__(this,"srawi",0x7c830670);
  puts("Testing srawi.");
  test_instruction_RRS__(this,"srawi.",0x7c830671);
  puts("Testing srw");
  test_instruction_RRRSH(this,"srw",0x7c832c30);
  puts("Testing srw.");
  test_instruction_RRRSH(this,"srw.",0x7c832c31);
  return;
}

Assistant:

void powerpc_test_cpu::test_shift(void)
{
#if TEST_SHIFT
	gen_xer_values(0, SO);
	TEST_INSTRUCTION(RRRSH,"slw",		_X (31,RA,RD,RB, 24,0));
	TEST_INSTRUCTION(RRRSH,"slw.",		_X (31,RA,RD,RB, 24,1));
	TEST_INSTRUCTION(RRRSH,"sraw",		_X (31,RA,RD,RB,792,0));
	TEST_INSTRUCTION(RRRSH,"sraw.",		_X (31,RA,RD,RB,792,1));
	TEST_INSTRUCTION(RRS__,"srawi",		_X (31,RA,RD,00,824,0));
	TEST_INSTRUCTION(RRS__,"srawi.",	_X (31,RA,RD,00,824,1));
	TEST_INSTRUCTION(RRRSH,"srw",		_X (31,RA,RD,RB,536,0));
	TEST_INSTRUCTION(RRRSH,"srw.",		_X (31,RA,RD,RB,536,1));
#endif
}